

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

QList<QMdiSubWindow_*> * __thiscall
QMdiAreaPrivate::subWindowList
          (QList<QMdiSubWindow_*> *__return_storage_ptr__,QMdiAreaPrivate *this,WindowOrder order,
          bool reversed)

{
  int iVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  long lVar3;
  Data *pDVar4;
  bool bVar5;
  uint uVar6;
  QObject *pQVar7;
  qsizetype qVar8;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  QMdiSubWindow *child;
  QObject *local_48;
  QObject *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QMdiSubWindow **)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar9 = (this->childWindows).d.size;
  if (lVar9 != 0) {
    if (order == StackingOrder) {
      lVar9 = *(long *)(*(long *)&((this->super_QAbstractScrollAreaPrivate).viewport)->field_0x8 +
                       0x28);
      if (lVar9 != 0) {
        lVar10 = 0;
        do {
          local_48 = (QObject *)QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject);
          if ((local_48 != (QObject *)0x0) &&
             (qVar8 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                                (&this->childWindows,(QMdiSubWindow **)&local_48,0), qVar8 != -1)) {
            if (reversed) {
              local_40 = local_48;
              QtPrivate::QPodArrayOps<QMdiSubWindow*>::emplace<QMdiSubWindow*&>
                        ((QPodArrayOps<QMdiSubWindow*> *)__return_storage_ptr__,0,
                         (QMdiSubWindow **)&local_40);
            }
            else {
              local_40 = local_48;
              QtPrivate::QPodArrayOps<QMdiSubWindow*>::emplace<QMdiSubWindow*&>
                        ((QPodArrayOps<QMdiSubWindow*> *)__return_storage_ptr__,
                         (__return_storage_ptr__->d).size,(QMdiSubWindow **)&local_40);
              QList<QMdiSubWindow_*>::end(__return_storage_ptr__);
            }
          }
          lVar10 = lVar10 + 8;
        } while (lVar9 << 3 != lVar10);
      }
    }
    else if (order == CreationOrder) {
      pQVar2 = (this->childWindows).d.ptr;
      lVar10 = 0;
      do {
        lVar3 = *(long *)((long)&(pQVar2->wp).d + lVar10);
        if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
          pQVar7 = (QObject *)0x0;
        }
        else {
          pQVar7 = *(QObject **)((long)&(pQVar2->wp).value + lVar10);
        }
        if (pQVar7 != (QObject *)0x0) {
          local_40 = pQVar7;
          if (reversed) {
            QtPrivate::QPodArrayOps<QMdiSubWindow*>::emplace<QMdiSubWindow*&>
                      ((QPodArrayOps<QMdiSubWindow*> *)__return_storage_ptr__,0,
                       (QMdiSubWindow **)&local_40);
          }
          else {
            QtPrivate::QPodArrayOps<QMdiSubWindow*>::emplace<QMdiSubWindow*&>
                      ((QPodArrayOps<QMdiSubWindow*> *)__return_storage_ptr__,
                       (__return_storage_ptr__->d).size,(QMdiSubWindow **)&local_40);
            QList<QMdiSubWindow_*>::end(__return_storage_ptr__);
          }
        }
        lVar10 = lVar10 + 0x10;
      } while (lVar9 << 4 != lVar10);
    }
    else {
      uVar6 = (int)(this->indicesToActivatedChildren).d.size - 1;
      if (-1 < (int)uVar6) {
        lVar9 = (ulong)uVar6 + 1;
        do {
          pQVar2 = (this->childWindows).d.ptr;
          iVar1 = (this->indicesToActivatedChildren).d.ptr[lVar9 + -1];
          pDVar4 = pQVar2[iVar1].wp.d;
          if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
            pQVar7 = (QObject *)0x0;
          }
          else {
            pQVar7 = pQVar2[iVar1].wp.value;
          }
          if (pQVar7 != (QObject *)0x0) {
            local_40 = pQVar7;
            if (reversed) {
              QtPrivate::QPodArrayOps<QMdiSubWindow*>::emplace<QMdiSubWindow*&>
                        ((QPodArrayOps<QMdiSubWindow*> *)__return_storage_ptr__,0,
                         (QMdiSubWindow **)&local_40);
            }
            else {
              QtPrivate::QPodArrayOps<QMdiSubWindow*>::emplace<QMdiSubWindow*&>
                        ((QPodArrayOps<QMdiSubWindow*> *)__return_storage_ptr__,
                         (__return_storage_ptr__->d).size,(QMdiSubWindow **)&local_40);
              QList<QMdiSubWindow_*>::end(__return_storage_ptr__);
            }
          }
          lVar10 = lVar9 + -1;
          bVar5 = 0 < lVar9;
          lVar9 = lVar10;
        } while (lVar10 != 0 && bVar5);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QMdiSubWindow*>
QMdiAreaPrivate::subWindowList(QMdiArea::WindowOrder order, bool reversed) const
{
    QList<QMdiSubWindow *> list;
    if (childWindows.isEmpty())
        return list;

    if (order == QMdiArea::CreationOrder) {
        for (QMdiSubWindow *child : childWindows) {
            if (!child)
                continue;
            if (!reversed)
                list.append(child);
            else
                list.prepend(child);
        }
    } else if (order == QMdiArea::StackingOrder) {
        for (QObject *object : viewport->children()) {
            QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(object);
            if (!child || !childWindows.contains(child))
                continue;
            if (!reversed)
                list.append(child);
            else
                list.prepend(child);
        }
    } else { // ActivationHistoryOrder
        Q_ASSERT(indicesToActivatedChildren.size() == childWindows.size());
        for (int i = indicesToActivatedChildren.size() - 1; i >= 0; --i) {
            QMdiSubWindow *child = childWindows.at(indicesToActivatedChildren.at(i));
            if (!child)
                continue;
            if (!reversed)
                list.append(child);
            else
                list.prepend(child);
        }
    }
    return list;
}